

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qundoview.cpp
# Opt level: O2

void __thiscall QUndoView::setGroup(QUndoView *this,QUndoGroup *group)

{
  QWeakPointer<QObject> *this_00;
  long lVar1;
  QUndoModel *this_01;
  bool bVar2;
  QUndoGroup *pQVar3;
  QUndoStack *stack;
  char *pcVar4;
  QObject *pQVar5;
  long in_FS_OFFSET;
  Connection CStack_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QListView).super_QAbstractItemView.super_QAbstractScrollArea.
                    super_QFrame.super_QWidget.field_0x8;
  if ((*(long *)(lVar1 + 0x5c0) == 0) || (*(int *)(*(long *)(lVar1 + 0x5c0) + 4) == 0)) {
    pQVar3 = (QUndoGroup *)0x0;
  }
  else {
    pQVar3 = *(QUndoGroup **)(lVar1 + 0x5c8);
  }
  if (pQVar3 != group) {
    this_00 = (QWeakPointer<QObject> *)(lVar1 + 0x5c0);
    bVar2 = QWeakPointer<QObject>::isNull(this_00);
    if (!bVar2) {
      if ((this_00->d == (Data *)0x0) || (*(int *)(this_00->d + 4) == 0)) {
        pQVar5 = (QObject *)0x0;
      }
      else {
        pQVar5 = *(QObject **)(lVar1 + 0x5c8);
      }
      QObject::disconnect(pQVar5,"2activeStackChanged(QUndoStack*)",*(QObject **)(lVar1 + 0x5d0),
                          "1setStack(QUndoStack*)");
    }
    QWeakPointer<QObject>::assign<QObject>(this_00,(QObject *)group);
    bVar2 = QWeakPointer<QObject>::isNull(this_00);
    if (bVar2) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        QUndoModel::setStack(*(QUndoModel **)(lVar1 + 0x5d0),(QUndoStack *)0x0);
        return;
      }
      goto LAB_005e3701;
    }
    if ((this_00->d == (Data *)0x0) || (*(int *)(this_00->d + 4) == 0)) {
      pcVar4 = (char *)0x0;
    }
    else {
      pcVar4 = *(char **)(lVar1 + 0x5c8);
    }
    QObject::connect((QObject *)&CStack_28,pcVar4,(QObject *)"2activeStackChanged(QUndoStack*)",
                     *(char **)(lVar1 + 0x5d0),0x67e616);
    QMetaObject::Connection::~Connection(&CStack_28);
    this_01 = *(QUndoModel **)(lVar1 + 0x5d0);
    stack = (QUndoStack *)QUndoGroup::activeStack();
    QUndoModel::setStack(this_01,stack);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
LAB_005e3701:
  __stack_chk_fail();
}

Assistant:

void QUndoView::setGroup(QUndoGroup *group)
{
    Q_D(QUndoView);

    if (d->group == group)
        return;

    if (d->group != nullptr) {
        disconnect(d->group, SIGNAL(activeStackChanged(QUndoStack*)),
                d->model, SLOT(setStack(QUndoStack*)));
    }

    d->group = group;

    if (d->group != nullptr) {
        connect(d->group, SIGNAL(activeStackChanged(QUndoStack*)),
                d->model, SLOT(setStack(QUndoStack*)));
        d->model->setStack(d->group->activeStack());
    } else {
        d->model->setStack(nullptr);
    }
}